

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::Data
          (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *this,
          Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *other,size_t reserved)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  QObject *pQVar3;
  Data *pDVar4;
  Node<QObject_*,_QPointer<QHttp2Stream>_> *pNVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t numBuckets;
  R RVar10;
  Bucket BVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->numBuckets = 0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar7 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar7 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pSVar2 = other->spans;
      lVar9 = 0;
      do {
        uVar6 = (ulong)pSVar2->offsets[lVar9 + lVar7];
        if (uVar6 != 0xff) {
          key = pSVar2[uVar8].entries + uVar6;
          pQVar3 = *(QObject **)(key->storage).data;
          uVar6 = ((ulong)pQVar3 >> 0x20 ^ (ulong)pQVar3) * -0x2917014799a6026d;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          BVar11 = Data<QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>>::
                   findBucketWithHash<QObject*>
                             ((Data<QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>> *)this,
                              (QObject **)key,uVar6 >> 0x20 ^ this->seed ^ uVar6);
          pNVar5 = Span<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::insert
                             (BVar11.span,BVar11.index);
          pNVar5->key = *(QObject **)(key->storage).data;
          pDVar4 = *(Data **)((key->storage).data + 8);
          (pNVar5->value).wp.d = pDVar4;
          (pNVar5->value).wp.value = *(QObject **)((key->storage).data + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (uVar8 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }